

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O1

void InsertVars(Cube *pC,int *pVars,int nVarsIn,int *pVarValues)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  
  if ((nVarsIn < 1) || (g_CoverInfo.nVarsIn < nVarsIn)) {
    __assert_fail("nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                  ,0x17d,"void InsertVars(Cube *, int *, int, int *)");
  }
  uVar3 = 0;
  do {
    iVar1 = pVars[uVar3];
    if ((iVar1 < 0) || (g_CoverInfo.nVarsIn <= iVar1)) {
      __assert_fail("pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                    ,0x180,"void InsertVars(Cube *, int *, int, int *)");
    }
    if (2 < pVarValues[uVar3] - 1U) {
      __assert_fail("pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/exor/exorBits.c"
                    ,0x181,"void InsertVars(Cube *, int *, int, int *)");
    }
    iVar4 = iVar1 * 2 >> 5;
    bVar2 = (byte)(iVar1 * 2);
    pC->pCubeDataIn[iVar4] =
         pVarValues[uVar3] << (bVar2 & 0x1f) | ~(3 << (bVar2 & 0x1f)) & pC->pCubeDataIn[iVar4];
    uVar3 = uVar3 + 1;
  } while ((uint)nVarsIn != uVar3);
  return;
}

Assistant:

void InsertVars( Cube * pC, int * pVars, int nVarsIn, int * pVarValues )
// corrects the given number of variables (nVarsIn) in pC->pCubeDataIn[]
// variable numbers are given in pVarNumbers[], their values are in pVarValues[]
// arrays pVarNumbers[] and pVarValues[] are provided by the user
{
    int GlobalBit;
    int LocalWord;
    int LocalBit;
    int i;
    assert( nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn );
    for ( i = 0; i < nVarsIn; i++ )
    {
        assert( pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn );
        assert( pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS );
        GlobalBit = (pVars[i]<<1);
        LocalWord = VarWord(GlobalBit);
        LocalBit  = VarBit(GlobalBit);

        // correct this variables
        pC->pCubeDataIn[LocalWord] = ((pC->pCubeDataIn[LocalWord]&(~(3<<LocalBit)))|(pVarValues[i]<<LocalBit));
    }
}